

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-signal.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  size_t __size;
  char *__ptr;
  
  if (argc != 2) {
switchD_001011a8_caseD_0:
    exit(1);
  }
  uVar1 = atoi(argv[1]);
  switch(uVar1) {
  case 0:
    goto switchD_001011a8_caseD_0;
  case 1:
    __ptr = "SIGHUP\n";
    goto LAB_00101476;
  case 2:
    __ptr = "User interrupt\n";
    __size = 0xf;
    goto LAB_00101493;
  case 3:
    __ptr = "SIGQUIT\n";
    break;
  case 4:
    __ptr = "Illegal instruction\n";
    __size = 0x14;
    goto LAB_00101493;
  case 5:
    __ptr = "SIGTRAP\n";
    break;
  case 6:
    __ptr = "Subprocess aborted\nChild aborted\n";
    __size = 0x21;
    goto LAB_00101493;
  case 7:
    __ptr = "Bus error\n";
    goto LAB_00101360;
  case 8:
    __ptr = "Floating-point exception\n";
    __size = 0x19;
    goto LAB_00101493;
  case 9:
    __ptr = "Subprocess killed\nChild killed\n";
    __size = 0x1f;
    goto LAB_00101493;
  case 10:
    __ptr = "SIGUSR1\n";
    break;
  case 0xb:
    __ptr = "Segmentation fault\n";
    __size = 0x13;
    goto LAB_00101493;
  case 0xc:
    __ptr = "SIGUSR2\n";
    break;
  case 0xd:
    __ptr = "SIGPIPE\n";
    break;
  case 0xe:
    __ptr = "SIGALRM\n";
    break;
  case 0xf:
    __ptr = "Subprocess terminated\nChild terminated\n";
    __size = 0x27;
    goto LAB_00101493;
  case 0x10:
    __ptr = "SIGSTKFLT\n";
    goto LAB_00101360;
  case 0x11:
    __ptr = "SIGCHLD\n";
    break;
  case 0x12:
    __ptr = "SIGCONT\n";
    break;
  case 0x13:
    __ptr = "SIGSTOP\n";
    break;
  case 0x14:
    __ptr = "SIGTSTP\n";
    break;
  case 0x15:
    __ptr = "SIGTTIN\n";
    break;
  case 0x16:
    __ptr = "SIGTTOU\n";
    break;
  case 0x17:
    __ptr = "SIGURG\n";
    goto LAB_00101476;
  case 0x18:
    __ptr = "SIGXCPU\n";
    break;
  case 0x19:
    __ptr = "SIGXFSZ\n";
    break;
  case 0x1a:
    __ptr = "SIGVTALRM\n";
LAB_00101360:
    __size = 10;
    goto LAB_00101493;
  case 0x1b:
    __ptr = "SIGPROF\n";
    break;
  case 0x1c:
    __ptr = "SIGWINCH\n";
    __size = 9;
    goto LAB_00101493;
  case 0x1d:
    __ptr = "SIGPOLL\n";
    break;
  case 0x1e:
    __ptr = "SIGPWR\n";
    goto LAB_00101476;
  case 0x1f:
    __ptr = "SIGSYS\n";
LAB_00101476:
    __size = 7;
    goto LAB_00101493;
  default:
    fprintf(_stdout,"Signal %d\n",(ulong)uVar1);
    goto LAB_0010149d;
  }
  __size = 8;
LAB_00101493:
  fwrite(__ptr,__size,1,_stdout);
LAB_0010149d:
  fflush(_stdout);
  return 0;
}

Assistant:

int
main(int argc, char **argv)
{
	if (argc != 2) {
		exit(1);
	}

	int sig = atoi(argv[1]);
	if (sig == 0) {
		exit(1);
	}

	switch (sig) {
#ifdef SIGSEGV
	case SIGSEGV:
		fprintf(stdout, "Segmentation fault\n");
		break;
#endif
#ifdef SIGBUS
#if !defined(SIGSEGV) || SIGBUS != SIGSEGV
	case SIGBUS:
		fprintf(stdout, "Bus error\n");
		break;
#endif
#endif
#ifdef SIGFPE
	case SIGFPE:
		fprintf(stdout, "Floating-point exception\n");
		break;
#endif
#ifdef SIGILL
	case SIGILL:
		fprintf(stdout, "Illegal instruction\n");
		break;
#endif
#ifdef SIGINT
	case SIGINT:
		fprintf(stdout, "User interrupt\n");
		break;
#endif
#ifdef SIGABRT
	case SIGABRT:
		fprintf(stdout, "Subprocess aborted\nChild aborted\n");
		break;
#endif
#ifdef SIGKILL
	case SIGKILL:
		fprintf(stdout, "Subprocess killed\nChild killed\n");
		break;
#endif
#ifdef SIGTERM
	case SIGTERM:
		fprintf(stdout, "Subprocess terminated\nChild terminated\n");
		break;
#endif
#ifdef SIGHUP
	case SIGHUP:
		fprintf(stdout, "SIGHUP\n");
		break;
#endif
#ifdef SIGQUIT
	case SIGQUIT:
		fprintf(stdout, "SIGQUIT\n");
		break;
#endif
#ifdef SIGTRAP
	case SIGTRAP:
		fprintf(stdout, "SIGTRAP\n");
		break;
#endif
#ifdef SIGIOT
#if !defined(SIGABRT) || SIGIOT != SIGABRT
	case SIGIOT:
		fprintf(stdout, "SIGIOT\n");
		break;
#endif
#endif
#ifdef SIGUSR1
	case SIGUSR1:
		fprintf(stdout, "SIGUSR1\n");
		break;
#endif
#ifdef SIGUSR2
	case SIGUSR2:
		fprintf(stdout, "SIGUSR2\n");
		break;
#endif
#ifdef SIGPIPE
	case SIGPIPE:
		fprintf(stdout, "SIGPIPE\n");
		break;
#endif
#ifdef SIGALRM
	case SIGALRM:
		fprintf(stdout, "SIGALRM\n");
		break;
#endif
#ifdef SIGSTKFLT
	case SIGSTKFLT:
		fprintf(stdout, "SIGSTKFLT\n");
		break;
#endif
#ifdef SIGCHLD
	case SIGCHLD:
		fprintf(stdout, "SIGCHLD\n");
		break;
#elif defined(SIGCLD)
	case SIGCLD:
		fprintf(stdout, "SIGCLD\n");
		break;
#endif
#ifdef SIGCONT
	case SIGCONT:
		fprintf(stdout, "SIGCONT\n");
		break;
#endif
#ifdef SIGSTOP
	case SIGSTOP:
		fprintf(stdout, "SIGSTOP\n");
		break;
#endif
#ifdef SIGTSTP
	case SIGTSTP:
		fprintf(stdout, "SIGTSTP\n");
		break;
#endif
#ifdef SIGTTIN
	case SIGTTIN:
		fprintf(stdout, "SIGTTIN\n");
		break;
#endif
#ifdef SIGTTOU
	case SIGTTOU:
		fprintf(stdout, "SIGTTOU\n");
		break;
#endif
#ifdef SIGURG
	case SIGURG:
		fprintf(stdout, "SIGURG\n");
		break;
#endif
#ifdef SIGXCPU
	case SIGXCPU:
		fprintf(stdout, "SIGXCPU\n");
		break;
#endif
#ifdef SIGXFSZ
	case SIGXFSZ:
		fprintf(stdout, "SIGXFSZ\n");
		break;
#endif
#ifdef SIGVTALRM
	case SIGVTALRM:
		fprintf(stdout, "SIGVTALRM\n");
		break;
#endif
#ifdef SIGPROF
	case SIGPROF:
		fprintf(stdout, "SIGPROF\n");
		break;
#endif
#ifdef SIGWINCH
	case SIGWINCH:
		fprintf(stdout, "SIGWINCH\n");
		break;
#endif
#ifdef SIGPOLL
	case SIGPOLL:
		fprintf(stdout, "SIGPOLL\n");
		break;
#endif
#ifdef SIGIO
#if !defined(SIGPOLL) || SIGIO != SIGPOLL
	case SIGIO:
		fprintf(stdout, "SIGIO\n");
		break;
#endif
#endif
#ifdef SIGPWR
	case SIGPWR:
		fprintf(stdout, "SIGPWR\n");
		break;
#endif
#ifdef SIGSYS
	case SIGSYS:
		fprintf(stdout, "SIGSYS\n");
		break;
#endif
#ifdef SIGUNUSED
#if !defined(SIGSYS) || SIGUNUSED != SIGSYS
	case SIGUNUSED:
		fprintf(stdout, "SIGUNUSED\n");
		break;
#endif
#endif
	default:
		fprintf(stdout, "Signal %d\n", sig);
		break;
	}

	fflush(stdout);
}